

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Omega_h::InputScalar::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,InputScalar *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

T InputScalar::get() const {
  T out;
  if (!as(out)) {
    auto full_name = get_full_name(*this);
    Omega_h_fail(
        "InputScalar \"%s\" string \"%s\" is not interpretable as a %s",
        full_name.c_str(), str.c_str(),
        (std::is_same<T, int>::value
                ? "int"
                : (std::is_same<T, double>::value
                          ? "double"
                          : (std::is_same<T, long long>::value
                                    ? "long long"
                                    : "unknown type"))));
  }
  return out;
}